

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O0

int __thiscall
QGraphicsColorizeEffect::qt_metacall(QGraphicsColorizeEffect *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  Call unaff_retaddr_00;
  QObject *in_stack_00000008;
  QMetaType local_10;
  void **_a_00;
  
  _a_00 = *(void ***)(in_FS_OFFSET + 0x28);
  iVar1 = QGraphicsEffect::qt_metacall
                    ((QGraphicsEffect *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                     (int)in_RCX,in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 4) {
        qt_static_metacall(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,_a_00);
      }
      iVar1 = iVar1 + -4;
    }
    if (in_ESI == 7) {
      if (iVar1 < 4) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      iVar1 = iVar1 + -4;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,_a_00);
      iVar1 = iVar1 + -2;
    }
  }
  if (*(void ***)(in_FS_OFFSET + 0x28) != _a_00) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QGraphicsColorizeEffect::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QGraphicsEffect::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 4;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}